

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_CELL ref_cell;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_BOOL has_qua;
  REF_BOOL has_tri;
  REF_BOOL has_edg;
  REF_INT ncell;
  REF_INT cell_to_swap [2];
  REF_INT nodes [27];
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  REF_INT local_b0;
  REF_INT local_ac;
  REF_INT local_a8 [30];
  
  ref_cell = ref_grid->cell[3];
  *allowed = 0;
  uVar2 = ref_cell_has_side(ref_grid->cell[0],node0,node1,&local_b8);
  if (uVar2 == 0) {
    uVar2 = ref_cell_has_side(ref_grid->cell[3],node0,node1,&local_bc);
    if (uVar2 == 0) {
      uVar2 = ref_cell_has_side(ref_grid->cell[6],node0,node1,&local_c0);
      if (uVar2 == 0) {
        if ((local_b8 == 0) && ((local_bc == 0 || (local_c0 == 0)))) {
          uVar2 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_b4,&local_b0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x163,"ref_swap_same_faceid",(ulong)uVar2,"more then two");
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            ref_swap_tattle_nodes(ref_cell,node0,node1);
            ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
            return uVar2;
          }
          if ((long)local_b4 == 2) {
            uVar2 = ref_cell_nodes(ref_cell,local_b0,local_a8);
            if (uVar2 == 0) {
              iVar1 = local_a8[ref_cell->node_per];
              uVar2 = ref_cell_nodes(ref_cell,local_ac,local_a8);
              if (uVar2 == 0) {
                if (iVar1 != local_a8[ref_cell->node_per]) {
                  return 0;
                }
                *allowed = 1;
                return 0;
              }
              pcVar4 = "nodes tri1";
              uVar3 = 0x171;
            }
            else {
              pcVar4 = "nodes tri0";
              uVar3 = 0x16f;
            }
            goto LAB_0020ddff;
          }
          if (local_b4 != 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x16d,"ref_swap_same_faceid","there should be zero or two triangles for manifold"
                   ,2,(long)local_b4);
            ref_node_location(ref_grid->node,node0);
            ref_node_location(ref_grid->node,node1);
            ref_export_by_extension(ref_grid,"ref_swap_same_faceid.tec");
            return 1;
          }
          *allowed = 1;
        }
        else {
          *allowed = 0;
        }
        return 0;
      }
      pcVar4 = "qua side";
      uVar3 = 0x158;
    }
    else {
      pcVar4 = "tri side";
      uVar3 = 0x156;
    }
  }
  else {
    pcVar4 = "edg side";
    uVar3 = 0x154;
  }
LAB_0020ddff:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar3,
         "ref_swap_same_faceid",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_swap_same_faceid(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell;
  REF_INT cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id0, id1;
  REF_BOOL has_edg, has_tri, has_qua;

  *allowed = REF_FALSE;

  RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edg),
      "edg side");
  RSS(ref_cell_has_side(ref_grid_tri(ref_grid), node0, node1, &has_tri),
      "tri side");
  RSS(ref_cell_has_side(ref_grid_qua(ref_grid), node0, node1, &has_qua),
      "qua side");
  if (has_edg || (has_tri && has_qua)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }
  RSB(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two", {
        ref_node_location(ref_grid_node(ref_grid), node0);
        ref_node_location(ref_grid_node(ref_grid), node1);
        ref_swap_tattle_nodes(ref_cell, node0, node1);
        ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
      });

  if (0 == ncell) { /* away from boundary */
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }
  REIB(2, ncell, "there should be zero or two triangles for manifold", {
    ref_node_location(ref_grid_node(ref_grid), node0);
    ref_node_location(ref_grid_node(ref_grid), node1);
    ref_export_by_extension(ref_grid, "ref_swap_same_faceid.tec");
  });

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  id0 = nodes[ref_cell_node_per(ref_cell)];
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  id1 = nodes[ref_cell_node_per(ref_cell)];

  if (id0 == id1) {
    *allowed = REF_TRUE;
    return REF_SUCCESS;
  }

  return REF_SUCCESS;
}